

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O2

void __thiscall AppParametersTest_arg_stop_Test::TestBody(AppParametersTest_arg_stop_Test *this)

{
  char *pcVar1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar2;
  AssertHelper local_240 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_238;
  AssertionResult gtest_ar;
  ArgWrapper<wchar_t> args;
  ArgWrapper<wchar_t> envs;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_1b0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_1a0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_190;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_180;
  app_parameters parameters;
  
  ArgWrapper<wchar_t>::
  ArgWrapper<wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*>
            (&args,L"/path/to/exe",L"--switch",L"-key",L"value",L"--",L"-other_key",L"value");
  ArgWrapper<wchar_t>::ArgWrapper<wchar_t_const*,wchar_t_const*>
            (&envs,L"key=other_value",L"other_key=some_value");
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (&parameters,
             (int)((ulong)((long)args.m_args.
                                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)args.m_args.
                                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5),
             (wchar_t **)
             args.m_argv._M_t.
             super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
             super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl,
             (wchar_t **)
             envs.m_argv._M_t.
             super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
             super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl,(unordered_set *)&gtest_ar)
  ;
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&gtest_ar);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_180,"key");
  local_238 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_arg_value
                        (&parameters,local_180._M_len,local_180._M_str,0,0);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[6]>
            ((internal *)&gtest_ar,"parameters.get_arg_value(u8\"key\")","u8\"value\"",&local_238,
             (char8_t (*) [6])0x392426);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x155,pcVar1);
    testing::internal::AssertHelper::operator=(local_240,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if ((long *)local_238._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_238._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_190,"key");
  bVar2 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
          jessilib::app_parameters::get_env_value(&parameters,local_190._M_len,local_190._M_str,0,0)
  ;
  local_238 = bVar2;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[12]>
            ((internal *)&gtest_ar,"parameters.get_env_value(u8\"key\")","u8\"other_value\"",
             &local_238,(char8_t (*) [12])"other_value");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x156,pcVar1);
    testing::internal::AssertHelper::operator=(local_240,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if ((long *)local_238._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_238._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_1a0,"key");
  bVar2 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
          jessilib::app_parameters::get_value(&parameters,local_1a0._M_len,local_1a0._M_str,0,0);
  local_238 = bVar2;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[6]>
            ((internal *)&gtest_ar,"parameters.get_value(u8\"key\")","u8\"value\"",&local_238,
             (char8_t (*) [6])0x392426);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x157,pcVar1);
    testing::internal::AssertHelper::operator=(local_240,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if ((long *)local_238._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_238._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
            (&local_1b0,"other_key");
  bVar2 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
          jessilib::app_parameters::get_value(&parameters,local_1b0._M_len,local_1b0._M_str,0,0);
  local_238 = bVar2;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[11]>
            ((internal *)&gtest_ar,"parameters.get_value(u8\"other_key\")","u8\"some_value\"",
             &local_238,(char8_t (*) [11])"some_value");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x158,pcVar1);
    testing::internal::AssertHelper::operator=(local_240,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if ((long *)local_238._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_238._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  jessilib::app_parameters::~app_parameters(&parameters);
  ArgWrapper<wchar_t>::~ArgWrapper(&envs);
  ArgWrapper<wchar_t>::~ArgWrapper(&args);
  return;
}

Assistant:

TEST(AppParametersTest, arg_stop) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe", L"--switch", L"-key", L"value", L"--", L"-other_key", L"value" };
	ArgWrapper<wchar_t> envs{ L"key=other_value", L"other_key=some_value" };
	app_parameters parameters{ args.argc(), args.argv(), envs.argv() };

	EXPECT_EQ(parameters.get_arg_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_env_value(u8"key"), u8"other_value");
	EXPECT_EQ(parameters.get_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_value(u8"other_key"), u8"some_value");
}